

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Instr * __thiscall
GlobOpt::ToVar(GlobOpt *this,Instr *instr,RegOpnd *regOpnd,BasicBlock *block,Value *value,
              bool needsUpdate)

{
  code *pcVar1;
  BasicBlock *pBVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  IntConstOpnd *src1Opnd;
  RegOpnd *pRVar6;
  Opnd *pOVar7;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar8;
  Instr *pIVar9;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  ValueInfo *local_b0;
  PropertySymOpnd *propertySymOpnd;
  Instr *insertAfterInstr;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_84;
  ValueType valueType;
  OpCode opcode;
  RegOpnd *regNew;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6e;
  int32 intConstantValue;
  StackSym *local_68;
  StackSym *typeSpecSym;
  ValueInfo *pVStack_58;
  IRType fromType;
  ValueInfo *valueInfo;
  StackSym *varSym;
  Instr *newInstr;
  Value *pVStack_38;
  bool needsUpdate_local;
  Value *value_local;
  BasicBlock *block_local;
  RegOpnd *regOpnd_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  valueInfo = (ValueInfo *)regOpnd->m_sym;
  newInstr._7_1_ = needsUpdate;
  pVStack_38 = value;
  value_local = (Value *)block;
  block_local = (BasicBlock *)regOpnd;
  regOpnd_local = (RegOpnd *)instr;
  instr_local = (Instr *)this;
  bVar3 = IsTypeSpecPhaseOff(this->func);
  if (bVar3) {
    this_local = (GlobOpt *)regOpnd_local;
  }
  else {
    bVar3 = IsLoopPrePass(this);
    if (bVar3) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (*(BVSparse<Memory::JitArenaAllocator> **)(value_local + 0x10),
                 *(BVIndex *)&valueInfo->symStore);
      this_local = (GlobOpt *)regOpnd_local;
    }
    else {
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                        (*(BVSparse<Memory::JitArenaAllocator> **)(value_local + 0x10),
                         *(BVIndex *)&valueInfo->symStore);
      if (BVar4 == '\0') {
        bVar3 = StackSym::IsVar((StackSym *)valueInfo);
        if (bVar3) {
          bVar3 = GlobOptBlockData::IsTypeSpecialized
                            ((GlobOptBlockData *)(value_local + 0xd),(Sym *)valueInfo);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x2c78,"(block->globOptData.IsTypeSpecialized(varSym))",
                               "block->globOptData.IsTypeSpecialized(varSym)");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          if (pVStack_38 == (Value *)0x0) {
            pVStack_38 = GlobOptBlockData::FindValue
                                   ((GlobOptBlockData *)(value_local + 0xd),(Sym *)valueInfo);
          }
          if (pVStack_38 == (Value *)0x0) {
            local_b0 = (ValueInfo *)0x0;
          }
          else {
            local_b0 = ::Value::GetValueInfo(pVStack_38);
          }
          pVStack_58 = local_b0;
          if ((local_b0 != (ValueInfo *)0x0) &&
             (bVar3 = ValueType::IsInt(&local_b0->super_ValueType), bVar3)) {
            BVSparse<Memory::JitArenaAllocator>::Clear
                      (*(BVSparse<Memory::JitArenaAllocator> **)(value_local + 0x11),
                       *(BVIndex *)&valueInfo->symStore);
          }
          typeSpecSym._7_1_ = TyIllegal;
          local_68 = (StackSym *)0x0;
          BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((BVSparse<Memory::JitArenaAllocator> *)value_local[0x10].valueInfo,
                             *(BVIndex *)&valueInfo->symStore);
          if ((BVar4 == '\0') ||
             (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                                (*(BVSparse<Memory::JitArenaAllocator> **)(value_local + 0x11),
                                 *(BVIndex *)&valueInfo->symStore), BVar4 != '\0')) {
            BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((BVSparse<Memory::JitArenaAllocator> *)value_local[0x11].valueInfo,
                               *(BVIndex *)&valueInfo->symStore);
            if (BVar4 == '\0') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x2cb6,"((0))","UNREACHED");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            else {
              typeSpecSym._7_1_ = TyFloat64;
              local_68 = StackSym::GetFloat64EquivSym((StackSym *)valueInfo,this->func);
              *(uint *)&local_68->field_0x18 = *(uint *)&local_68->field_0x18 & 0xfffdffff | 0x20000
              ;
              if (pVStack_58 == (ValueInfo *)0x0) {
                intConstantValue._0_2_ = ValueType::Float.field_0;
                pVStack_38 = NewGenericValue(this,ValueType::Float);
                pVStack_58 = ::Value::GetValueInfo(pVStack_38);
                GlobOptBlockData::SetValue
                          ((GlobOptBlockData *)(value_local + 0xd),pVStack_38,(Sym *)valueInfo);
                pBVar2 = block_local;
                paVar8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                         ValueInfo::Type(pVStack_58);
                local_6e.field_0 = *paVar8;
                IR::Opnd::SetValueType((Opnd *)pBVar2,(ValueType)local_6e.field_0);
              }
              else {
                bVar3 = ValueType::IsNumber(&pVStack_58->super_ValueType);
                if (!bVar3) {
                  pVStack_58 = ValueInfo::SpecializeToFloat64(pVStack_58,this->alloc);
                  ChangeValueInfo(this,(BasicBlock *)value_local,pVStack_38,pVStack_58,false,false);
                  pBVar2 = block_local;
                  paVar8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0
                            *)ValueInfo::Type(pVStack_58);
                  intConstantValue._2_2_ = *paVar8;
                  IR::Opnd::SetValueType((Opnd *)pBVar2,(ValueType)intConstantValue._2_2_);
                }
              }
            }
          }
          else {
            typeSpecSym._7_1_ = TyInt32;
            local_68 = StackSym::GetInt32EquivSym((StackSym *)valueInfo,this->func);
            if (pVStack_58 == (ValueInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x2c90,"(valueInfo)","valueInfo");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            bVar3 = ValueType::IsInt(&pVStack_58->super_ValueType);
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x2c91,"(valueInfo->IsInt())","valueInfo->IsInt()");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
          }
          if (pVStack_58 == (ValueInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x2cb9,"(valueInfo)","valueInfo");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          bVar3 = ValueInfo::TryGetIntConstantValue(pVStack_58,(int32 *)((long)&regNew + 4),false);
          pBVar2 = block_local;
          if (bVar3) {
            src1Opnd = IR::IntConstOpnd::New
                                 ((long)regNew._4_4_,TyInt32,
                                  (Func *)regOpnd_local[1].super_Opnd._vptr_Opnd,false);
            varSym = (StackSym *)
                     IR::Instr::New(LdC_A_I4,(Opnd *)pBVar2,&src1Opnd->super_Opnd,
                                    (Func *)regOpnd_local[1].super_Opnd._vptr_Opnd);
          }
          else {
            pRVar6 = IR::RegOpnd::New(local_68,typeSpecSym._7_1_,
                                      (Func *)regOpnd_local[1].super_Opnd._vptr_Opnd);
            IR::Opnd::SetIsJITOptimizedReg(&pRVar6->super_Opnd,true);
            varSym = (StackSym *)
                     IR::Instr::New(ToVar,(Opnd *)block_local,&pRVar6->super_Opnd,
                                    (Func *)regOpnd_local[1].super_Opnd._vptr_Opnd);
          }
          IR::Instr::SetByteCodeOffset((Instr *)varSym,(Instr *)regOpnd_local);
          pOVar7 = IR::Instr::GetDst((Instr *)varSym);
          pRVar6 = IR::Opnd::AsRegOpnd(pOVar7);
          IR::Opnd::SetIsJITOptimizedReg(&pRVar6->super_Opnd,true);
          paVar8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                   ValueInfo::Type(pVStack_58);
          local_84.field_0 = *paVar8;
          if (typeSpecSym._7_1_ == TyInt32) {
            local_84.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::GetTaggedInt();
          }
          pOVar7 = IR::Instr::GetDst((Instr *)varSym);
          IR::Opnd::SetValueType(pOVar7,(ValueType)local_84.field_0);
          pOVar7 = IR::Instr::GetSrc1((Instr *)varSym);
          IR::Opnd::SetValueType(pOVar7,(ValueType)local_84.field_0);
          pRVar6 = regOpnd_local;
          propertySymOpnd = *(PropertySymOpnd **)&regOpnd_local->field_0x18;
          pIVar9 = BasicBlock::GetLastInstr((BasicBlock *)value_local);
          if (((Instr *)pRVar6 == pIVar9) &&
             ((bVar3 = IR::Instr::IsBranchInstr((Instr *)regOpnd_local), bVar3 ||
              (*(short *)&regOpnd_local[1].m_sym == 0x236)))) {
            for (; *(short *)&propertySymOpnd->m_runtimePolymorphicInlineCache == 0x244;
                propertySymOpnd = *(PropertySymOpnd **)&(propertySymOpnd->super_SymOpnd).m_offset) {
            }
          }
          BasicBlock::InsertInstrAfter
                    ((BasicBlock *)value_local,(Instr *)varSym,(Instr *)propertySymOpnd);
          BVSparse<Memory::JitArenaAllocator>::Set
                    (*(BVSparse<Memory::JitArenaAllocator> **)(value_local + 0x10),
                     *(BVIndex *)&valueInfo->symStore);
          sourceContextId = Func::GetSourceContextId(this->func);
          functionId = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01ec1678,GlobOptPhase,sourceContextId,functionId);
          if (bVar3) {
            Output::Print(L"TRACE ");
            bVar3 = IsLoopPrePass(this);
            if (bVar3) {
              Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                            (ulong)(this->prePassLoop->loopNumber - 1));
            }
            Output::Print(L": ");
            IR::Opnd::Dump((Opnd *)block_local);
            Output::Print(L" : ");
            Output::Print(L"Converting to var\n");
            Output::Flush();
          }
          if (*(long *)(value_local + 1) != 0) {
            bVar3 = IsLoopPrePass(this);
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x2cef,"(!this->IsLoopPrePass())","!this->IsLoopPrePass()");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            TryHoistInvariant(this,(Instr *)varSym,(BasicBlock *)value_local,pVStack_38,pVStack_38,
                              (Value *)0x0,false,false,false,BailOutInvalid);
          }
          if ((newInstr._7_1_ & 1) != 0) {
            ProcessKills(this,(Instr *)varSym);
            pOVar7 = IR::Instr::GetDst((Instr *)varSym);
            ValueNumberObjectType(this,pOVar7,(Instr *)varSym);
            pOVar7 = IR::Instr::GetSrc1((Instr *)regOpnd_local);
            if (pOVar7 != (Opnd *)0x0) {
              pOVar7 = IR::Instr::GetSrc1((Instr *)regOpnd_local);
              bVar3 = IR::Opnd::IsSymOpnd(pOVar7);
              if (bVar3) {
                pOVar7 = IR::Instr::GetSrc1((Instr *)regOpnd_local);
                this_00 = IR::Opnd::AsSymOpnd(pOVar7);
                bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_00);
                if (bVar3) {
                  pOVar7 = IR::Instr::GetSrc1((Instr *)regOpnd_local);
                  this_01 = IR::Opnd::AsPropertySymOpnd(pOVar7);
                  bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
                  if (bVar3) {
                    IR::PropertySymOpnd::SetTypeChecked(this_01,false);
                    IR::PropertySymOpnd::SetTypeAvailable(this_01,false);
                    IR::PropertySymOpnd::SetWriteGuardChecked(this_01,false);
                  }
                  FinishOptPropOp(this,(Instr *)regOpnd_local,this_01,(BasicBlock *)0x0,false,
                                  (bool *)0x0,(bool *)0x0);
                  pOVar7 = IR::Instr::GetSrc1((Instr *)regOpnd_local);
                  regOpnd_local =
                       (RegOpnd *)
                       SetTypeCheckBailOut(this,pOVar7,(Instr *)regOpnd_local,(BailOutInfo *)0x0);
                }
              }
            }
          }
          this_local = (GlobOpt *)regOpnd_local;
        }
        else {
          bVar3 = StackSym::IsTypeSpec((StackSym *)valueInfo);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x2c73,"(!varSym->IsTypeSpec())","!varSym->IsTypeSpec()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          this_local = (GlobOpt *)regOpnd_local;
        }
      }
      else {
        this_local = (GlobOpt *)regOpnd_local;
      }
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
GlobOpt::ToVar(IR::Instr *instr, IR::RegOpnd *regOpnd, BasicBlock *block, Value *value, bool needsUpdate)
{
    IR::Instr *newInstr;
    StackSym *varSym = regOpnd->m_sym;

    if (IsTypeSpecPhaseOff(this->func))
    {
        return instr;
    }

    if (this->IsLoopPrePass())
    {
        block->globOptData.liveVarSyms->Set(varSym->m_id);
        return instr;
    }

    if (block->globOptData.liveVarSyms->Test(varSym->m_id))
    {
        // Already live, nothing to do
        return instr;
    }

    if (!varSym->IsVar())
    {
        Assert(!varSym->IsTypeSpec());
        // Leave non-vars alone.
        return instr;
    }

    Assert(block->globOptData.IsTypeSpecialized(varSym));

    if (!value)
    {
        value = block->globOptData.FindValue(varSym);
    }

    ValueInfo *valueInfo = value ? value->GetValueInfo() : nullptr;
    if(valueInfo && valueInfo->IsInt())
    {
        // If two syms have the same value, one is lossy-int-specialized, and then the other is int-specialized, the value
        // would have been updated to definitely int. Upon using the lossy-int-specialized sym later, it would be flagged as
        // lossy while the value is definitely int. Since the bit-vectors are based on the sym and not the value, update the
        // lossy state.
        block->globOptData.liveLossyInt32Syms->Clear(varSym->m_id);
    }

    IRType fromType = TyIllegal;
    StackSym *typeSpecSym = nullptr;

    if (block->globOptData.liveInt32Syms->Test(varSym->m_id) && !block->globOptData.liveLossyInt32Syms->Test(varSym->m_id))
    {
        fromType = TyInt32;
        typeSpecSym = varSym->GetInt32EquivSym(this->func);
        Assert(valueInfo);
        Assert(valueInfo->IsInt());
    }
    else if (block->globOptData.liveFloat64Syms->Test(varSym->m_id))
    {

        fromType = TyFloat64;
        typeSpecSym = varSym->GetFloat64EquivSym(this->func);

        // Ensure that all bailout FromVars that generate a value for this type-specialized sym will bail out on any non-number
        // value, even ones that have already been generated before. Float-specialized non-number values cannot be converted
        // back to Var since they will not go back to the original non-number value. The dead-store pass will update the bailout
        // kind on already-generated FromVars based on this bit.
        typeSpecSym->m_requiresBailOnNotNumber = true;

        // A previous float conversion may have used BailOutPrimitiveButString, which does not change the value type to say
        // definitely float, since it can also be a non-string primitive. The convert back to Var though, will cause that
        // bailout kind to be changed to BailOutNumberOnly in the dead-store phase, so from the point of the initial conversion
        // to float, that the value is definitely number. Since we don't know where the FromVar is, change the value type here.
        if(valueInfo)
        {
            if(!valueInfo->IsNumber())
            {
                valueInfo = valueInfo->SpecializeToFloat64(alloc);
                ChangeValueInfo(block, value, valueInfo);
                regOpnd->SetValueType(valueInfo->Type());
            }
        }
        else
        {
            value = NewGenericValue(ValueType::Float);
            valueInfo = value->GetValueInfo();
            block->globOptData.SetValue(value, varSym);
            regOpnd->SetValueType(valueInfo->Type());
        }
    }
    else
    {
        Assert(UNREACHED);
    }

    AssertOrFailFast(valueInfo);

    int32 intConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        // Lower will tag or create a number directly
        newInstr = IR::Instr::New(Js::OpCode::LdC_A_I4, regOpnd,
            IR::IntConstOpnd::New(intConstantValue, TyInt32, instr->m_func), instr->m_func);
    }
    else
    {
        IR::RegOpnd * regNew = IR::RegOpnd::New(typeSpecSym, fromType, instr->m_func);
        Js::OpCode opcode = Js::OpCode::ToVar;
        regNew->SetIsJITOptimizedReg(true);

        newInstr = IR::Instr::New(opcode, regOpnd, regNew, instr->m_func);
    }
    newInstr->SetByteCodeOffset(instr);
    newInstr->GetDst()->AsRegOpnd()->SetIsJITOptimizedReg(true);

    ValueType valueType = valueInfo->Type();
    if(fromType == TyInt32)
    {
    #if !INT32VAR // All 32-bit ints are taggable on 64-bit architectures
        IntConstantBounds constantBounds;
        AssertVerify(valueInfo->TryGetIntConstantBounds(&constantBounds));
        if(constantBounds.IsTaggable())
    #endif
        {
            // The value is within the taggable range, so set the opnd value types to TaggedInt to avoid the overflow check
            valueType = ValueType::GetTaggedInt();
        }
    }
    newInstr->GetDst()->SetValueType(valueType);
    newInstr->GetSrc1()->SetValueType(valueType);

    IR::Instr *insertAfterInstr = instr->m_prev;
    if (instr == block->GetLastInstr() &&
        (instr->IsBranchInstr() || instr->m_opcode == Js::OpCode::BailTarget))
    {
        // Don't insert code between the branch and the preceding ByteCodeUses instrs...
        while(insertAfterInstr->m_opcode == Js::OpCode::ByteCodeUses)
        {
            insertAfterInstr = insertAfterInstr->m_prev;
        }
    }
    block->InsertInstrAfter(newInstr, insertAfterInstr);

    block->globOptData.liveVarSyms->Set(varSym->m_id);

    GOPT_TRACE_OPND(regOpnd, _u("Converting to var\n"));

    if (block->loop)
    {
        Assert(!this->IsLoopPrePass());
        this->TryHoistInvariant(newInstr, block, value, value, nullptr, false);
    }

    if (needsUpdate)
    {
        // Make sure that the kill effect of the ToVar instruction is tracked and that the kill of a property
        // type is reflected in the current instruction.
        this->ProcessKills(newInstr);
        this->ValueNumberObjectType(newInstr->GetDst(), newInstr);

        if (instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
        {
            // Reprocess the load source. We need to reset the PropertySymOpnd fields first.
            IR::PropertySymOpnd *propertySymOpnd = instr->GetSrc1()->AsPropertySymOpnd();
            if (propertySymOpnd->IsTypeCheckSeqCandidate())
            {
                propertySymOpnd->SetTypeChecked(false);
                propertySymOpnd->SetTypeAvailable(false);
                propertySymOpnd->SetWriteGuardChecked(false);
            }

            this->FinishOptPropOp(instr, propertySymOpnd);
            instr = this->SetTypeCheckBailOut(instr->GetSrc1(), instr, nullptr);
        }
    }

    return instr;
}